

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_ReadObject(JSContext *ctx,uint8_t *buf,size_t buf_len,int flags)

{
  int iVar1;
  JSAtom JVar2;
  JSString *p;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  JSValue JVar7;
  byte local_69;
  BCReaderState ss;
  int64_t iVar3;
  
  ctx->binary_object_count = ctx->binary_object_count + 1;
  ctx->binary_object_size = ctx->binary_object_size + (int)buf_len;
  ss.objects_count = 0;
  ss.objects_size = 0;
  ss.objects = (JSObject **)0x0;
  ss.idx_to_atom = (JSAtom *)0x0;
  ss.buf_end = buf + buf_len;
  ss._48_8_ = (ulong)((flags & 8U) << 0x15 | (uint)flags >> 2 & 1 | (flags & 2U) << 0xf |
                     (flags & 1U) << 8) << 0x20;
  ss.first_atom = 0xd2;
  if ((flags & 1U) == 0) {
    ss.first_atom = 1;
  }
  ss.idx_to_atom_count = 0;
  ss.ctx = ctx;
  ss.buf_start = buf;
  ss.ptr = buf;
  iVar1 = bc_get_u8(&ss,&local_69);
  if (iVar1 == 0) {
    if (local_69 == 1) {
      iVar1 = bc_get_leb128(&ss,&ss.idx_to_atom_count);
      if (iVar1 == 0) {
        uVar6 = (ulong)ss.idx_to_atom_count;
        if (uVar6 != 0) {
          ss.idx_to_atom = (JSAtom *)js_mallocz(ss.ctx,uVar6 * 4);
          if (ss.idx_to_atom == (JSAtom *)0x0) {
LAB_001266c7:
            ss.error_state = -1;
            goto LAB_0012665b;
          }
        }
        for (uVar5 = 0; uVar5 < uVar6; uVar5 = uVar5 + 1) {
          p = JS_ReadString(&ss);
          if (p == (JSString *)0x0) goto LAB_0012665b;
          JVar2 = JS_NewAtomStr(ss.ctx,p);
          if (JVar2 == 0) goto LAB_001266c7;
          ss.idx_to_atom[uVar5] = JVar2;
          if (((ss._48_8_ & 0xff000000000000) != 0) && (ss.first_atom + (int)uVar5 != JVar2)) {
            ss._48_8_ = ss._48_8_ & 0xff00ffffffffffff;
          }
          uVar6 = (ulong)ss.idx_to_atom_count;
        }
        JVar7 = JS_ReadObjectRec(&ss);
        iVar3 = JVar7.tag;
        uVar6 = (ulong)JVar7.u.ptr & 0xffffffff00000000;
        uVar5 = (ulong)JVar7.u._0_4_;
        goto LAB_00126664;
      }
    }
    else {
      JS_ThrowSyntaxError(ss.ctx,"invalid version (%d expected=%d)",(ulong)local_69,1);
    }
  }
LAB_0012665b:
  iVar3 = 6;
  uVar5 = 0;
  uVar6 = 0;
LAB_00126664:
  if (ss.idx_to_atom != (JSAtom *)0x0) {
    for (uVar4 = 0; uVar4 < ss.idx_to_atom_count; uVar4 = uVar4 + 1) {
      JS_FreeAtom(ss.ctx,ss.idx_to_atom[uVar4]);
    }
    (*((ss.ctx)->rt->mf).js_free)(&(ss.ctx)->rt->malloc_state,ss.idx_to_atom);
  }
  (*((ss.ctx)->rt->mf).js_free)(&(ss.ctx)->rt->malloc_state,ss.objects);
  JVar7.tag = iVar3;
  JVar7.u.ptr = (void *)(uVar6 | uVar5);
  return JVar7;
}

Assistant:

JSValue JS_ReadObject(JSContext *ctx, const uint8_t *buf, size_t buf_len,
                       int flags)
{
    BCReaderState ss, *s = &ss;
    JSValue obj;

    ctx->binary_object_count += 1;
    ctx->binary_object_size += buf_len;

    memset(s, 0, sizeof(*s));
    s->ctx = ctx;
    s->buf_start = buf;
    s->buf_end = buf + buf_len;
    s->ptr = buf;
    s->allow_bytecode = ((flags & JS_READ_OBJ_BYTECODE) != 0);
    s->is_rom_data = ((flags & JS_READ_OBJ_ROM_DATA) != 0);
    s->allow_sab = ((flags & JS_READ_OBJ_SAB) != 0);
    s->allow_reference = ((flags & JS_READ_OBJ_REFERENCE) != 0);
    if (s->allow_bytecode)
        s->first_atom = JS_ATOM_END;
    else
        s->first_atom = 1;
    if (JS_ReadObjectAtoms(s)) {
        obj = JS_EXCEPTION;
    } else {
        obj = JS_ReadObjectRec(s);
    }
    bc_reader_free(s);
    return obj;
}